

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O2

int quicly_sentmap_update
              (quicly_sentmap_t *map,quicly_sentmap_iter_t *iter,quicly_sentmap_event_t event)

{
  byte *pbVar1;
  quicly_sent_acked_cb p_Var2;
  int iVar3;
  quicly_sent_t *pqVar4;
  ulong uVar5;
  quicly_sent_packet_t packet;
  quicly_sent_packet_t local_48;
  
  pqVar4 = iter->p;
  if (pqVar4 == &quicly_sentmap__end_iter) {
    __assert_fail("iter->p != &quicly_sentmap__end_iter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                  ,0x89,
                  "int quicly_sentmap_update(quicly_sentmap_t *, quicly_sentmap_iter_t *, quicly_sentmap_event_t)"
                 );
  }
  if (pqVar4->acked == quicly_sentmap__type_packet) {
    local_48._16_8_ = (pqVar4->data).stream.args.end;
    local_48.packet_number = (pqVar4->data).packet.packet_number;
    local_48.sent_at = (pqVar4->data).packet.sent_at;
    uVar5 = (ulong)local_48._16_8_ >> 0x10 & 0xffff;
    if (event != QUICLY_SENTMAP_EVENT_PTO && uVar5 != 0) {
      if (map->bytes_in_flight < uVar5) {
        __assert_fail("map->bytes_in_flight >= packet.cc_bytes_in_flight",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                      ,0x91,
                      "int quicly_sentmap_update(quicly_sentmap_t *, quicly_sentmap_iter_t *, quicly_sentmap_event_t)"
                     );
      }
      map->bytes_in_flight = map->bytes_in_flight - uVar5;
      (pqVar4->data).packet.cc_bytes_in_flight = 0;
      pqVar4 = iter->p;
    }
    pbVar1 = (byte *)((long)&pqVar4->data + 0x11);
    *pbVar1 = *pbVar1 & 0xfd;
    uVar5 = local_48._16_8_ & 0x200;
    if ((event == QUICLY_SENTMAP_EVENT_EXPIRED) || (event == QUICLY_SENTMAP_EVENT_ACKED)) {
      discard_entry(map,iter);
      map->num_packets = map->num_packets - 1;
    }
    while( true ) {
      next_entry(iter);
      p_Var2 = iter->p->acked;
      if (p_Var2 == quicly_sentmap__type_packet) {
        return 0;
      }
      if ((event == QUICLY_SENTMAP_EVENT_ACKED || uVar5 != 0) &&
         (iVar3 = (*p_Var2)(map,&local_48,(uint)(event == QUICLY_SENTMAP_EVENT_ACKED),iter->p),
         iVar3 != 0)) break;
      if ((event == QUICLY_SENTMAP_EVENT_EXPIRED) || (event == QUICLY_SENTMAP_EVENT_ACKED)) {
        discard_entry(map,iter);
      }
    }
    return iVar3;
  }
  __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                ,0x8a,
                "int quicly_sentmap_update(quicly_sentmap_t *, quicly_sentmap_iter_t *, quicly_sentmap_event_t)"
               );
}

Assistant:

int quicly_sentmap_update(quicly_sentmap_t *map, quicly_sentmap_iter_t *iter, quicly_sentmap_event_t event)
{
    quicly_sent_packet_t packet;
    int ret = 0;

    assert(iter->p != &quicly_sentmap__end_iter);
    assert(iter->p->acked == quicly_sentmap__type_packet);

    /* copy packet info */
    packet = iter->p->data.packet;

    /* update CC state unless the event is PTO */
    if (packet.cc_bytes_in_flight != 0 && event != QUICLY_SENTMAP_EVENT_PTO) {
        assert(map->bytes_in_flight >= packet.cc_bytes_in_flight);
        map->bytes_in_flight -= packet.cc_bytes_in_flight;
        iter->p->data.packet.cc_bytes_in_flight = 0;
    }
    iter->p->data.packet.frames_in_flight = 0;

    int should_notify = event == QUICLY_SENTMAP_EVENT_ACKED || packet.frames_in_flight,
        should_discard = event == QUICLY_SENTMAP_EVENT_ACKED || event == QUICLY_SENTMAP_EVENT_EXPIRED;

    /* Advance to next packet, while if necessary, doing either or both of the following:
     * * discard entries (if should_discard is set)
     * * invoke the frame-level callbacks (if should_notify is set) */
    if (should_discard) {
        discard_entry(map, iter);
        --map->num_packets;
    }
    for (next_entry(iter); iter->p->acked != quicly_sentmap__type_packet; next_entry(iter)) {
        if (should_notify && (ret = iter->p->acked(map, &packet, event == QUICLY_SENTMAP_EVENT_ACKED, iter->p)) != 0)
            goto Exit;
        if (should_discard)
            discard_entry(map, iter);
    }

Exit:
    return ret;
}